

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O2

void __thiscall
GmmLib::GmmGen9TextureCalc::GetMipTailGeometryOffset
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel,uint32_t *OffsetX,
          uint32_t *OffsetY,uint32_t *OffsetZ)

{
  uint32_t uVar1;
  uint32_t uVar2;
  anon_struct_8_44_94931171_for_Info aVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  GMM_MIPTAIL_SLOT_OFFSET (*paGVar8) [5];
  
  uVar1 = pTexInfo->BitsPerPixel;
  uVar6 = uVar1 << 0x1d | uVar1 - 8 >> 3;
  if (uVar6 < 8) {
    lVar7 = *(long *)(&DAT_001c80e8 + (ulong)uVar6 * 8);
  }
  else {
    lVar7 = 0;
  }
  switch(pTexInfo->Type) {
  case RESOURCE_1D:
    lVar5 = (ulong)((SUB84((pTexInfo->Flags).Info,4) >> 3 & 4) +
                   (MipLevel - (pTexInfo->Alignment).MipTailStartLod)) * 0x3c;
    paGVar8 = Gen9MipTailSlotOffset1DSurface;
    break;
  case RESOURCE_2D:
  case RESOURCE_CUBE:
    aVar3 = (pTexInfo->Flags).Info;
    if (((ulong)aVar3 >> 0x26 & 1) == 0) {
      uVar6 = aVar3._4_4_ >> 3 & 4;
    }
    else {
      uVar2 = (pTexInfo->MSAA).NumSamples;
      if (uVar2 == 4) {
        uVar6 = 2;
      }
      else if (uVar2 == 8) {
        uVar6 = 3;
      }
      else if (uVar2 == 0x10) {
        uVar6 = 4;
      }
      else {
        uVar6 = (uint)(uVar2 == 2);
      }
    }
    lVar5 = (ulong)((MipLevel - (pTexInfo->Alignment).MipTailStartLod) + uVar6) * 0x3c;
    paGVar8 = Gen9MipTailSlotOffset2DSurface;
    break;
  case RESOURCE_3D:
    lVar5 = (ulong)((SUB84((pTexInfo->Flags).Info,4) >> 3 & 4) +
                   (MipLevel - (pTexInfo->Alignment).MipTailStartLod)) * 0x3c;
    paGVar8 = Gen9MipTailSlotOffset3DSurface;
    break;
  default:
    goto switchD_001b262b_default;
  }
  piVar4 = (int *)((long)&(*paGVar8)[lVar7].X + lVar5);
  *OffsetX = uVar1 * *piVar4 >> 3;
  *OffsetY = piVar4[1];
  *OffsetZ = piVar4[2];
switchD_001b262b_default:
  return;
}

Assistant:

void GmmLib::GmmGen9TextureCalc::GetMipTailGeometryOffset(GMM_TEXTURE_INFO *pTexInfo,
                                                          uint32_t          MipLevel,
                                                          uint32_t *        OffsetX,
                                                          uint32_t *        OffsetY,
                                                          uint32_t *        OffsetZ)
{
    uint32_t ArrayIndex = 0;
    uint32_t Slot       = 0;

    GMM_DPF_ENTER;

    switch(pTexInfo->BitsPerPixel)
    {
        case 128:
            ArrayIndex = 0;
            break;
        case 64:
            ArrayIndex = 1;
            break;
        case 32:
            ArrayIndex = 2;
            break;
        case 16:
            ArrayIndex = 3;
            break;
        case 8:
            ArrayIndex = 4;
            break;
        default:
            __GMM_ASSERT(0);
            break;
    }

    if(pTexInfo->Type == RESOURCE_1D)
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               (pTexInfo->Flags.Info.TiledYf ? 4 : 0);

        *OffsetX = Gen9MipTailSlotOffset1DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen9MipTailSlotOffset1DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen9MipTailSlotOffset1DSurface[Slot][ArrayIndex].Z;
    }
    else if(pTexInfo->Type == RESOURCE_2D || pTexInfo->Type == RESOURCE_CUBE)
    {
        // clang-format off
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
                    // TileYs
                   ((pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 16) ? 4 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  8) ? 3 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  4) ? 2 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  2) ? 1 :
                    (pTexInfo->Flags.Info.TiledYs                                   ) ? 0 :
                    // TileYf
                    (pTexInfo->Flags.Info.TiledYf                                   ) ?  4: 0);
        // clang-format on

        *OffsetX = Gen9MipTailSlotOffset2DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen9MipTailSlotOffset2DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen9MipTailSlotOffset2DSurface[Slot][ArrayIndex].Z;
    }
    else if(pTexInfo->Type == RESOURCE_3D)
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               (pTexInfo->Flags.Info.TiledYf ? 4 : 0);

        *OffsetX = Gen9MipTailSlotOffset3DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen9MipTailSlotOffset3DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen9MipTailSlotOffset3DSurface[Slot][ArrayIndex].Z;
    }

    GMM_DPF_EXIT;
    return;
}